

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dmatrix.h
# Opt level: O0

int __thiscall gmath::DMatrix<double>::init(DMatrix<double> *this,EVP_PKEY_CTX *ctx)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  double *pdVar3;
  DMatrix<double> *pDVar4;
  int in_EDX;
  int i_1;
  int i;
  uint local_18;
  int local_14;
  
  if ((this->v != (double *)0x0) && (this->v != (double *)0x0)) {
    operator_delete__(this->v);
  }
  this->nrows = (int)ctx;
  this->ncols = in_EDX;
  this->n = this->nrows * this->ncols;
  this->v = (double *)0x0;
  pDVar4 = this;
  if (0 < this->n) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (long)this->n;
    uVar2 = SUB168(auVar1 * ZEXT816(8),0);
    if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
      uVar2 = 0xffffffffffffffff;
    }
    pdVar3 = (double *)operator_new__(uVar2);
    this->v = pdVar3;
    for (local_14 = 0; local_14 < this->n; local_14 = local_14 + 1) {
      this->v[local_14] = 0.0;
    }
    for (local_18 = 0; pDVar4 = (DMatrix<double> *)(ulong)local_18, (int)local_18 < this->n;
        local_18 = in_EDX + 1 + local_18) {
      this->v[(int)local_18] = 1.0;
    }
  }
  return (int)pDVar4;
}

Assistant:

void init(int rows=0, int cols=0)
    {
      if (v != 0)
      {
        delete [] v;
      }

      nrows=rows;
      ncols=cols;
      n=nrows*ncols;

      v=0;

      if (n > 0)
      {
        v=new T[n];

        for (int i=0; i<n; i++)
        {
          v[i]=0;
        }

        for (int i=0; i<n; i+=cols+1)
        {
          v[i]=1;
        }
      }
    }